

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * sqlite3WhereMalloc(WhereInfo *pWInfo,u64 nByte)

{
  WhereMemBlock *pWVar1;
  
  pWVar1 = (WhereMemBlock *)sqlite3DbMallocRawNN(pWInfo->pParse->db,nByte + 0x10);
  if (pWVar1 == (WhereMemBlock *)0x0) {
    pWVar1 = (WhereMemBlock *)0x0;
  }
  else {
    pWVar1->pNext = pWInfo->pMemToFree;
    pWVar1->sz = nByte;
    pWInfo->pMemToFree = pWVar1;
    pWVar1 = pWVar1 + 1;
  }
  return pWVar1;
}

Assistant:

SQLITE_PRIVATE void *sqlite3WhereMalloc(WhereInfo *pWInfo, u64 nByte){
  WhereMemBlock *pBlock;
  pBlock = sqlite3DbMallocRawNN(pWInfo->pParse->db, nByte+sizeof(*pBlock));
  if( pBlock ){
    pBlock->pNext = pWInfo->pMemToFree;
    pBlock->sz = nByte;
    pWInfo->pMemToFree = pBlock;
    pBlock++;
  }
  return (void*)pBlock;
}